

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall mp::QuadTerms::negate(QuadTerms *this)

{
  pair<std::pair<int,_int>,_double> *iv;
  ptr ppVar1;
  long lVar2;
  
  ppVar1 = (this->folded_).
           super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
           m_data.
           super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
           m_data_ptr;
  for (lVar2 = (this->folded_).
               super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
               m_data.
               super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
               .m_size << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    ppVar1->second = -ppVar1->second;
    ppVar1 = ppVar1 + 1;
  }
  return;
}

Assistant:

constexpr size_ty size     (void) const noexcept { return m_size; }